

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O2

string * ws::wx_decrypt_aes(string *__return_storage_ptr__,string *str_encrypt,string *key)

{
  uchar *out;
  MsgCryptoError *pMVar1;
  size_t __n;
  size_type __n_00;
  allocator<char> local_199;
  uchar local_198 [8];
  uchar auStack_190 [8];
  string local_188;
  string local_168;
  uchar ckey [32];
  AES_KEY aesKey;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  out = (uchar *)malloc(str_encrypt->_M_string_length);
  if (out == (uchar *)0x0) {
    pMVar1 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"malloc error",(allocator<char> *)&aesKey);
    MsgCryptoError::MsgCryptoError(pMVar1,&local_168,(source_location)0x195148);
    __cxa_throw(pMVar1,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
  }
  ckey[0x10] = '\0';
  ckey[0x11] = '\0';
  ckey[0x12] = '\0';
  ckey[0x13] = '\0';
  ckey[0x14] = '\0';
  ckey[0x15] = '\0';
  ckey[0x16] = '\0';
  ckey[0x17] = '\0';
  ckey[0x18] = '\0';
  ckey[0x19] = '\0';
  ckey[0x1a] = '\0';
  ckey[0x1b] = '\0';
  ckey[0x1c] = '\0';
  ckey[0x1d] = '\0';
  ckey[0x1e] = '\0';
  ckey[0x1f] = '\0';
  ckey[0] = '\0';
  ckey[1] = '\0';
  ckey[2] = '\0';
  ckey[3] = '\0';
  ckey[4] = '\0';
  ckey[5] = '\0';
  ckey[6] = '\0';
  ckey[7] = '\0';
  ckey[8] = '\0';
  ckey[9] = '\0';
  ckey[10] = '\0';
  ckey[0xb] = '\0';
  ckey[0xc] = '\0';
  ckey[0xd] = '\0';
  ckey[0xe] = '\0';
  ckey[0xf] = '\0';
  __n = 0x20;
  if (key->_M_string_length < 0x20) {
    __n = key->_M_string_length;
  }
  memcpy(ckey,(key->_M_dataplus)._M_p,__n);
  local_198[0] = ckey[0];
  local_198[1] = ckey[1];
  local_198[2] = ckey[2];
  local_198[3] = ckey[3];
  local_198[4] = ckey[4];
  local_198[5] = ckey[5];
  local_198[6] = ckey[6];
  local_198[7] = ckey[7];
  auStack_190[0] = ckey[8];
  auStack_190[1] = ckey[9];
  auStack_190[2] = ckey[10];
  auStack_190[3] = ckey[0xb];
  auStack_190[4] = ckey[0xc];
  auStack_190[5] = ckey[0xd];
  auStack_190[6] = ckey[0xe];
  auStack_190[7] = ckey[0xf];
  AES_set_decrypt_key(ckey,0x100,(AES_KEY *)&aesKey);
  AES_cbc_encrypt((uchar *)(str_encrypt->_M_dataplus)._M_p,out,str_encrypt->_M_string_length,
                  (AES_KEY *)&aesKey,local_198,0);
  if (((byte)(out[str_encrypt->_M_string_length - 1] - 1) < 0x20) &&
     (__n_00 = str_encrypt->_M_string_length - (ulong)out[str_encrypt->_M_string_length - 1],
     __n_00 != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(char *)out,__n_00);
    free(out);
    return __return_storage_ptr__;
  }
  pMVar1 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"wx_decrypt_aes failed.",&local_199);
  MsgCryptoError::MsgCryptoError(pMVar1,&local_188,(source_location)0x195160);
  __cxa_throw(pMVar1,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_decrypt_aes(const std::string &str_encrypt, const std::string &key)
  {
    std::string result;
  
  
    auto out = (unsigned char *) malloc(str_encrypt.size());
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
  
    unsigned char ckey[32] = {0};
    unsigned char iv[16] = {0};
    memcpy(ckey, key.c_str(), key.size() > 32 ? 32 : key.size());
    //memcpy(iv, ckey, sizeof(iv) < sizeof(ckey) ? sizeof(iv) : sizeof(ckey));
    memcpy(iv, ckey, sizeof(iv));
    
    AES_KEY aesKey;
    AES_set_decrypt_key(ckey, 8 * 32, &aesKey);
    AES_cbc_encrypt((unsigned char *) str_encrypt.c_str(), out, str_encrypt.size(), &aesKey, iv, AES_DECRYPT);
    if (out[str_encrypt.size() - 1] > 0 && out[str_encrypt.size() - 1] <= 32 &&
        (str_encrypt.size() - out[str_encrypt.size() - 1]) > 0)
      result.append((char *) out, str_encrypt.size() - out[str_encrypt.size() - 1]);
    else
    {
      throw MsgCryptoError("wx_decrypt_aes failed.");
    }
  
    free(out);
    return result;
  }